

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void close_state(lua_State *L)

{
  void *pvVar1;
  void *in_RDI;
  lua_State *unaff_retaddr;
  global_State *g;
  StkId in_stack_00000018;
  lua_State *in_stack_00000020;
  lua_State *in_stack_ffffffffffffffe8;
  lua_State *L_00;
  
  L_00 = *(lua_State **)((long)in_RDI + 0x20);
  luaF_close(in_stack_00000020,in_stack_00000018);
  luaC_freeall(L_00);
  luaM_realloc_(unaff_retaddr,in_RDI,(size_t)L_00,(size_t)in_stack_ffffffffffffffe8);
  pvVar1 = luaM_realloc_(unaff_retaddr,in_RDI,(size_t)L_00,(size_t)in_stack_ffffffffffffffe8);
  *(void **)&L_00->stacksize = pvVar1;
  L_00->basehookcount = 0;
  L_00->hookcount = 0;
  freestack(L_00,in_stack_ffffffffffffffe8);
  (*(code *)L_00->top)(L_00->base,in_RDI,0x268,0);
  return;
}

Assistant:

static void close_state(lua_State*L){
global_State*g=G(L);
luaF_close(L,L->stack);
luaC_freeall(L);
luaM_freearray(L,G(L)->strt.hash,G(L)->strt.size,TString*);
luaZ_freebuffer(L,&g->buff);
freestack(L,L);
(*g->frealloc)(g->ud,fromstate(L),state_size(LG),0);
}